

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeGPRnopcRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  
  DVar1 = MCDisassembler_Fail;
  if (RegNo < 0x10) {
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[RegNo]);
    DVar1 = MCDisassembler_Success;
  }
  if (DVar1 + ~MCDisassembler_SoftFail < 2) {
    DVar1 = (uint)(RegNo != 0xf) * 2 + MCDisassembler_SoftFail;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeGPRnopcRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	if (RegNo == 15) 
		S = MCDisassembler_SoftFail;

	Check(&S, DecodeGPRRegisterClass(Inst, RegNo, Address, Decoder));

	return S;
}